

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_ExtraLogging.cpp
# Opt level: O3

void __thiscall
RenX_ExtraLoggingPlugin::RenX_OnRaw(RenX_ExtraLoggingPlugin *this,Server *server,string_view raw)

{
  size_type sVar1;
  pointer pcVar2;
  FILE *__s;
  string cPrefix;
  long *local_50;
  size_t local_48;
  long local_40 [2];
  
  if (this->printToConsole == true) {
    sVar1 = (this->consolePrefix)._M_string_length;
    if (sVar1 != 0) {
      pcVar2 = (this->consolePrefix)._M_dataplus._M_p;
      local_50 = local_40;
      std::__cxx11::string::_M_construct<char*>((string *)&local_50,pcVar2,pcVar2 + sVar1);
      RenX::processTags((string *)&local_50,server,(PlayerInfo *)0x0,(PlayerInfo *)0x0,
                        (BuildingInfo *)0x0);
      fwrite(local_50,1,local_48,_stdout);
      fputc(0x20,_stdout);
      if (local_50 != local_40) {
        operator_delete(local_50,local_40[0] + 1);
      }
    }
    fwrite(raw._M_str,1,raw._M_len,_stdout);
    fputs("\r\n",_stdout);
  }
  __s = (FILE *)this->file;
  if (__s != (FILE *)0x0) {
    sVar1 = (this->filePrefix)._M_string_length;
    if (sVar1 != 0) {
      pcVar2 = (this->filePrefix)._M_dataplus._M_p;
      local_50 = local_40;
      std::__cxx11::string::_M_construct<char*>((string *)&local_50,pcVar2,pcVar2 + sVar1);
      RenX::processTags((string *)&local_50,server,(PlayerInfo *)0x0,(PlayerInfo *)0x0,
                        (BuildingInfo *)0x0);
      fwrite(local_50,1,local_48,(FILE *)this->file);
      fputc(0x20,(FILE *)this->file);
      if (local_50 != local_40) {
        operator_delete(local_50,local_40[0] + 1);
      }
      __s = (FILE *)this->file;
    }
    fwrite(raw._M_str,1,raw._M_len,__s);
    fputs("\r\n",(FILE *)this->file);
    fflush((FILE *)this->file);
  }
  return;
}

Assistant:

void RenX_ExtraLoggingPlugin::RenX_OnRaw(RenX::Server &server, std::string_view raw) {
	if (RenX_ExtraLoggingPlugin::printToConsole) {
		if (!RenX_ExtraLoggingPlugin::consolePrefix.empty()) {
			std::string cPrefix = RenX_ExtraLoggingPlugin::consolePrefix;
			RenX::processTags(cPrefix, &server);
			fwrite(cPrefix.data(), sizeof(char), cPrefix.size(), stdout);
			fputc(' ', stdout);
		}
		fwrite(raw.data(), sizeof(char), raw.size(), stdout);
		fputs("\r\n", stdout);
	}

	if (RenX_ExtraLoggingPlugin::file != nullptr) {
		if (!RenX_ExtraLoggingPlugin::filePrefix.empty()) {
			std::string fPrefix = RenX_ExtraLoggingPlugin::filePrefix;
			RenX::processTags(fPrefix, &server);
			fwrite(fPrefix.data(), sizeof(char), fPrefix.size(), file);
			fputc(' ', RenX_ExtraLoggingPlugin::file);
		}
		fwrite(raw.data(), sizeof(char), raw.size(), file);
		fputs("\r\n", file);
		fflush(RenX_ExtraLoggingPlugin::file);
	}
}